

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::TreeEnsembleClassifier::TreeEnsembleClassifier
          (TreeEnsembleClassifier *this,TreeEnsembleClassifier *from)

{
  bool bVar1;
  ClassLabelsCase CVar2;
  InternalMetadataWithArenaLite *this_00;
  TreeEnsembleParameters *this_01;
  StringVector *this_02;
  StringVector *from_00;
  Int64Vector *this_03;
  Int64Vector *from_01;
  TreeEnsembleClassifier *from_local;
  TreeEnsembleClassifier *this_local;
  string *local_20;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__TreeEnsembleClassifier_00575ab8;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  ClassLabelsUnion::ClassLabelsUnion((ClassLabelsUnion *)&this->ClassLabels_);
  this->_cached_size_ = 0;
  this_00 = &from->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = (string *)
                 google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_00);
    }
    else {
      local_20 = google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,local_20);
  }
  bVar1 = has_treeensemble(from);
  if (bVar1) {
    this_01 = (TreeEnsembleParameters *)operator_new(0x50);
    TreeEnsembleParameters::TreeEnsembleParameters(this_01,from->treeensemble_);
    this->treeensemble_ = this_01;
  }
  else {
    this->treeensemble_ = (TreeEnsembleParameters *)0x0;
  }
  this->postevaluationtransform_ = from->postevaluationtransform_;
  clear_has_ClassLabels(this);
  CVar2 = ClassLabels_case(from);
  if (CVar2 != CLASSLABELS_NOT_SET) {
    if (CVar2 == kStringClassLabels) {
      this_02 = mutable_stringclasslabels(this);
      from_00 = stringclasslabels(from);
      StringVector::MergeFrom(this_02,from_00);
    }
    else if (CVar2 == kInt64ClassLabels) {
      this_03 = mutable_int64classlabels(this);
      from_01 = int64classlabels(from);
      Int64Vector::MergeFrom(this_03,from_01);
    }
  }
  return;
}

Assistant:

TreeEnsembleClassifier::TreeEnsembleClassifier(const TreeEnsembleClassifier& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_treeensemble()) {
    treeensemble_ = new ::CoreML::Specification::TreeEnsembleParameters(*from.treeensemble_);
  } else {
    treeensemble_ = NULL;
  }
  postevaluationtransform_ = from.postevaluationtransform_;
  clear_has_ClassLabels();
  switch (from.ClassLabels_case()) {
    case kStringClassLabels: {
      mutable_stringclasslabels()->::CoreML::Specification::StringVector::MergeFrom(from.stringclasslabels());
      break;
    }
    case kInt64ClassLabels: {
      mutable_int64classlabels()->::CoreML::Specification::Int64Vector::MergeFrom(from.int64classlabels());
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.TreeEnsembleClassifier)
}